

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O2

int mem_compress_open(char *filename,int rwmode,int *hdl)

{
  int handle;
  bool bVar1;
  uchar uVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  size_t msize;
  FILE *diskfile;
  uchar buffer [4];
  
  if (rwmode != 0) {
    ffpmsg("cannot open compressed file with WRITE access (mem_compress_open)");
    ffpmsg(filename);
    return 0x70;
  }
  iVar4 = file_openfile(filename,0,&diskfile);
  if (iVar4 != 0) {
    ffpmsg("failed to open compressed disk file (compress_open)");
    goto LAB_001117c5;
  }
  sVar5 = fread(buffer,1,2,(FILE *)diskfile);
  if (sVar5 != 2) {
    fclose((FILE *)diskfile);
    return 0x6c;
  }
  if (buffer._0_2_ == -0x74e1) {
    fseek((FILE *)diskfile,0,2);
    uVar6 = ftell((FILE *)diskfile);
    fseek((FILE *)diskfile,-4,1);
    fread(buffer,1,4,(FILE *)diskfile);
    uVar10 = (ulong)(ushort)buffer._0_2_;
    uVar2 = buffer[2];
    uVar7 = (ulong)buffer[3] << 0x18;
    if (uVar6 < 0x2711) {
      uVar6 = (ulong)(uint3)buffer._0_3_;
    }
    else {
      uVar7 = uVar7 | (ulong)uVar2 << 0x10 | uVar10;
      if ((long)uVar6 <= (long)uVar7) {
        uVar6 = uVar7;
      }
      uVar6 = (uVar6 - uVar7) + 0xffffffff & 0xffffffff00000000;
    }
    msize = uVar6 | uVar7;
LAB_001118e1:
    bVar1 = false;
    bVar3 = false;
    if (msize == 0) goto LAB_001118e9;
  }
  else {
    if (buffer._0_2_ == 0x4b50) {
      fseek((FILE *)diskfile,0x16,0);
      fread(buffer,1,4,(FILE *)diskfile);
      msize = (size_t)(uint)buffer;
      goto LAB_001118e1;
    }
    bVar3 = true;
    if (((((uint)buffer & 0xffff) != 0x1e1f) && (((uint)buffer & 0xffff) != 0x9d1f)) &&
       (buffer._0_2_ != -0x5fe1)) {
      fclose((FILE *)diskfile);
      return 1;
    }
LAB_001118e9:
    bVar1 = bVar3;
    fseek((FILE *)diskfile,0,2);
    lVar8 = ftell((FILE *)diskfile);
    msize = lVar8 * 3;
  }
  fseek((FILE *)diskfile,0,0);
  iVar4 = mem_createmem(msize,hdl);
  if ((bVar1) && (iVar4 != 0)) {
    iVar4 = mem_createmem(msize / 3,hdl);
  }
  if (iVar4 == 0) {
    iVar4 = mem_uncompress2mem(filename,diskfile,*hdl);
    fclose((FILE *)diskfile);
    handle = *hdl;
    if (iVar4 == 0) {
      if (*memTable[handle].memsizeptr <= memTable[handle].fitsfilesize + 0x100U) {
        return 0;
      }
      pcVar9 = (char *)realloc(*memTable[handle].memaddrptr,memTable[handle].fitsfilesize);
      if (pcVar9 == (char *)0x0) {
        ffpmsg("Failed to reduce size of allocated memory (compress_open)");
        return 0x71;
      }
      iVar4 = *hdl;
      *memTable[iVar4].memaddrptr = pcVar9;
      *memTable[iVar4].memsizeptr = memTable[iVar4].fitsfilesize;
      return 0;
    }
    mem_close_free(handle);
    filename = "failed to uncompress file into memory (compress_open)";
  }
  else {
    fclose((FILE *)diskfile);
    filename = "failed to create empty memory file (compress_open)";
  }
LAB_001117c5:
  ffpmsg(filename);
  return iVar4;
}

Assistant:

int mem_compress_open(char *filename, int rwmode, int *hdl)
/*
  This routine opens the compressed diskfile and creates an empty memory
  buffer with an appropriate size, then calls mem_uncompress2mem.
*/
{
    FILE *diskfile;
    int status, estimated = 1;
    unsigned char buffer[4];
    size_t finalsize, filesize;
    LONGLONG llsize = 0;
    unsigned int modulosize;
    char *ptr;

    if (rwmode != READONLY)
    {
        ffpmsg(
  "cannot open compressed file with WRITE access (mem_compress_open)");
        ffpmsg(filename);
        return(READONLY_FILE);
    }

    /* open the compressed disk file */
    status = file_openfile(filename, READONLY, &diskfile);
    if (status)
    {
        ffpmsg("failed to open compressed disk file (compress_open)");
        ffpmsg(filename);
        return(status);
    }

    if (fread(buffer, 1, 2, diskfile) != 2)  /* read 2 bytes */
    {
        fclose(diskfile);
        return(READ_ERROR);
    }

    if (memcmp(buffer, "\037\213", 2) == 0)  /* GZIP */
    {
        /* the uncompressed file size is give at the end */
        /* of the file in the ISIZE field  (modulo 2^32) */

        fseek(diskfile, 0, 2);            /* move to end of file */
        filesize = ftell(diskfile);       /* position = size of file */
        fseek(diskfile, -4L, 1);          /* move back 4 bytes */
        fread(buffer, 1, 4L, diskfile);   /* read 4 bytes */

        /* have to worry about integer byte order */
	modulosize  = buffer[0];
	modulosize |= buffer[1] << 8;
	modulosize |= buffer[2] << 16;
	modulosize |= buffer[3] << 24;

/*
  the field ISIZE in the gzipped file header only stores 4 bytes and contains
  the uncompressed file size modulo 2^32.  If the uncompressed file size
  is less than the compressed file size (filesize), then one probably needs to
  add 2^32 = 4294967296 to the uncompressed file size, assuming that the gzip
  produces a compressed file that is smaller than the original file.

  But one must allow for the case of very small files, where the
  gzipped file may actually be larger then the original uncompressed file.
  Therefore, only perform the modulo 2^32 correction test if the compressed 
  file is greater than 10,000 bytes in size.  (Note: this threhold would
  fail only if the original file was greater than 2^32 bytes in size AND gzip 
  was able to compress it by more than a factor of 400,000 (!) which seems
  highly unlikely.)
  
  Also, obviously, this 2^32 modulo correction cannot be performed if the
  finalsize variable is only 32-bits long.  Typically, the 'size_t' integer
  type must be 8 bytes or larger in size to support data files that are 
  greater than 2 GB (2^31 bytes) in size.  
*/
        finalsize = modulosize;

        if (sizeof(size_t) > 4 && filesize > 10000) {
	    llsize = (LONGLONG) finalsize;  
	    /* use LONGLONG variable to suppress compiler warning */
            while (llsize <  (LONGLONG) filesize) llsize += 4294967296;

            finalsize = (size_t) llsize;
        }

        estimated = 0;  /* file size is known, not estimated */
    }
    else if (memcmp(buffer, "\120\113", 2) == 0)   /* PKZIP */
    {
        /* the uncompressed file size is give at byte 22 the file */

        fseek(diskfile, 22L, 0);            /* move to byte 22 */
        fread(buffer, 1, 4L, diskfile);   /* read 4 bytes */

        /* have to worry about integer byte order */
	modulosize  = buffer[0];
	modulosize |= buffer[1] << 8;
	modulosize |= buffer[2] << 16;
	modulosize |= buffer[3] << 24;
        finalsize = modulosize;

        estimated = 0;  /* file size is known, not estimated */
    }
    else if (memcmp(buffer, "\037\036", 2) == 0)  /* PACK */
        finalsize = 0;  /* for most methods we can't determine final size */
    else if (memcmp(buffer, "\037\235", 2) == 0)  /* LZW */
        finalsize = 0;  /* for most methods we can't determine final size */
    else if (memcmp(buffer, "\037\240", 2) == 0)  /* LZH */
        finalsize = 0;  /* for most methods we can't determine final size */
#if HAVE_BZIP2
    else if (memcmp(buffer, "BZ", 2) == 0)        /* BZip2 */
        finalsize = 0;  /* for most methods we can't determine final size */
#endif
    else
    {
        /* not a compressed file; this should never happen */
        fclose(diskfile);
        return(1);
    }